

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O3

_Bool utf8_reverse(char *p)

{
  char *pcVar1;
  ushort *puVar2;
  byte bVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  
  string_reverse(p);
  if (p == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar5 = p + -1;
    do {
      pcVar6 = pcVar5 + 1;
      pcVar1 = pcVar5 + 1;
      pcVar5 = pcVar6;
    } while (*pcVar1 != '\0');
  }
  while( true ) {
    while( true ) {
      pcVar5 = pcVar6;
      pcVar6 = pcVar5 + -1;
      if (pcVar6 <= p) {
        return true;
      }
      bVar3 = pcVar5[-1];
      uVar7 = (uint)(bVar3 >> 4);
      if (uVar7 - 0xc < 2) break;
      if (uVar7 == 0xe) {
        if ((long)pcVar6 - (long)p < 3) {
          return false;
        }
        cVar4 = pcVar5[-3];
        pcVar5[-3] = bVar3;
        *pcVar6 = cVar4;
        pcVar6 = pcVar5 + -3;
      }
      else if (uVar7 == 0xf) {
        if ((long)pcVar6 - (long)p < 4) {
          return false;
        }
        cVar4 = pcVar5[-4];
        pcVar5[-4] = bVar3;
        *pcVar6 = cVar4;
        puVar2 = (ushort *)(pcVar5 + -3);
        *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
        pcVar6 = pcVar5 + -4;
      }
    }
    if (pcVar6 == p || (long)pcVar6 - (long)p < 0) break;
    cVar4 = pcVar5[-2];
    pcVar5[-2] = bVar3;
    *pcVar6 = cVar4;
    pcVar6 = pcVar5 + -2;
  }
  return false;
}

Assistant:

bool utf8_reverse (char *p) {
    char *q = p;
    string_reverse(p);
    
    // now fix bass-ackwards UTF chars.
    while(q && *q) ++q; // find eos
    while(p < --q)
        switch( (*q & 0xF0) >> 4 ) {
            case 0xF: /* U+010000-U+10FFFF: four bytes. */
                if (q-p < 4) return false;
                SWP(*(q-0), *(q-3));
                SWP(*(q-1), *(q-2));
                q -= 3;
                break;
            case 0xE: /* U+000800-U+00FFFF: three bytes. */
                if (q-p < 3) return false;
                SWP(*(q-0), *(q-2));
                q -= 2;
                break;
            case 0xC: /* fall-through */
            case 0xD: /* U+000080-U+0007FF: two bytes. */
                if (q-p < 1) return false;
                SWP(*(q-0), *(q-1));
                q--;
                break;
        }
    return true;
}